

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O2

spv_result_t spvtools::val::NonUniformPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint16_t uVar2;
  bool bVar3;
  uint uVar4;
  spv_result_t sVar5;
  Op OVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int32_t iVar9;
  GroupOperation GVar10;
  Instruction *pIVar11;
  Op opcode;
  Op opcode_00;
  char *pcVar12;
  string operand;
  DiagnosticStream local_200;
  
  uVar1 = (inst->inst_).opcode;
  OVar6 = (Op)uVar1;
  bVar3 = spvOpcodeIsNonUniformGroupOperation(OVar6);
  if (OVar6 + ~OpGroupNonUniformQuadAnyKHR < 0xfffffffe && bVar3) {
    uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    sVar5 = ValidateExecutionScope(_,inst,uVar4);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
  }
  switch(OVar6) {
  case OpGroupNonUniformElect:
    bVar3 = ValidationState_t::IsBoolScalarType(_,(inst->inst_).type_id);
    if (bVar3) {
      return SPV_SUCCESS;
    }
LAB_00183471:
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar12 = "Result must be a boolean scalar type";
    break;
  case OpGroupNonUniformAll:
  case OpGroupNonUniformAny:
    bVar3 = ValidationState_t::IsBoolScalarType(_,(inst->inst_).type_id);
    if (!bVar3) goto LAB_00183471;
    uVar8 = ValidationState_t::GetOperandTypeId(_,inst,3);
    bVar3 = ValidationState_t::IsBoolScalarType(_,uVar8);
    if (bVar3) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar12 = "Predicate must be a boolean scalar type";
    break;
  case OpGroupNonUniformAllEqual:
    bVar3 = ValidationState_t::IsBoolScalarType(_,(inst->inst_).type_id);
    if (!bVar3) goto LAB_00183471;
    uVar8 = ValidationState_t::GetOperandTypeId(_,inst,3);
    bVar3 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar8);
    if (bVar3) {
      return SPV_SUCCESS;
    }
    bVar3 = ValidationState_t::IsIntScalarOrVectorType(_,uVar8);
    if (bVar3) {
      return SPV_SUCCESS;
    }
    bVar3 = ValidationState_t::IsBoolScalarOrVectorType(_,uVar8);
    if (bVar3) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar12 = "Value must be a scalar or vector of integer, floating-point, or boolean type";
    break;
  case OpGroupNonUniformBroadcast:
  case OpGroupNonUniformShuffle:
  case OpGroupNonUniformShuffleXor:
  case OpGroupNonUniformShuffleUp:
  case OpGroupNonUniformShuffleDown:
  case OpGroupNonUniformQuadBroadcast:
  case OpGroupNonUniformQuadSwap:
    uVar8 = (inst->inst_).type_id;
    bVar3 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar8);
    if (((bVar3) || (bVar3 = ValidationState_t::IsIntScalarOrVectorType(_,uVar8), bVar3)) ||
       (bVar3 = ValidationState_t::IsBoolScalarOrVectorType(_,uVar8), bVar3)) {
      uVar7 = ValidationState_t::GetOperandTypeId(_,inst,3);
      if (uVar7 != uVar8) goto LAB_001834d8;
      uVar8 = ValidationState_t::GetOperandTypeId(_,inst,4);
      bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar8);
      if (!bVar3) {
        (anonymous_namespace)::
        ValidateGroupNonUniformBroadcastShuffle(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)
        ::$_0::operator()::Op__const(&operand,(void *)(ulong)(inst->inst_).opcode,opcode);
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&local_200,(string *)&operand);
        pcVar12 = " must be an unsigned integer scalar";
        goto LAB_00183332;
      }
      uVar2 = (inst->inst_).opcode;
      if (uVar2 == 0x151) {
LAB_00182f22:
        if (0x104ff < _->version_) {
          return SPV_SUCCESS;
        }
      }
      else if (uVar2 != 0x16e) {
        if (uVar2 != 0x16d) {
          return SPV_SUCCESS;
        }
        goto LAB_00182f22;
      }
      uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,4);
      OVar6 = ValidationState_t::GetIdOpcode(_,uVar4);
      iVar9 = spvOpcodeIsConstant(OVar6);
      if (iVar9 != 0) {
        return SPV_SUCCESS;
      }
      (anonymous_namespace)::
      ValidateGroupNonUniformBroadcastShuffle(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)
      ::$_0::operator()::Op__const(&operand,(void *)(ulong)(inst->inst_).opcode,opcode_00);
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_200,"Before SPIR-V 1.5, ");
      std::operator<<((ostream *)&local_200,(string *)&operand);
      pcVar12 = " must be a constant instruction";
LAB_00183332:
      std::operator<<((ostream *)&local_200,pcVar12);
      DiagnosticStream::~DiagnosticStream(&local_200);
      std::__cxx11::string::_M_dispose();
      return local_200.error_;
    }
LAB_001836e1:
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar12 = "Result must be a scalar or vector of integer, floating-point, or boolean type";
    break;
  case OpGroupNonUniformBroadcastFirst:
    uVar8 = (inst->inst_).type_id;
    bVar3 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar8);
    if (((!bVar3) && (bVar3 = ValidationState_t::IsIntScalarOrVectorType(_,uVar8), !bVar3)) &&
       (bVar3 = ValidationState_t::IsBoolScalarOrVectorType(_,uVar8), !bVar3)) goto LAB_001836e1;
    uVar7 = ValidationState_t::GetOperandTypeId(_,inst,3);
    if (uVar7 == uVar8) {
      return SPV_SUCCESS;
    }
LAB_001834d8:
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar12 = "The type of Value must match the Result type";
    break;
  case OpGroupNonUniformBallot:
    bVar3 = ValidationState_t::IsUnsignedIntVectorType(_,(inst->inst_).type_id);
    if ((bVar3) && (uVar8 = ValidationState_t::GetDimension(_,(inst->inst_).type_id), uVar8 == 4)) {
      uVar8 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar3 = ValidationState_t::IsBoolScalarType(_,uVar8);
      if (bVar3) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Predicate must be a boolean scalar";
    }
    else {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Result must be a 4-component unsigned integer vector";
    }
    break;
  case OpGroupNonUniformInverseBallot:
    bVar3 = ValidationState_t::IsBoolScalarType(_,(inst->inst_).type_id);
    if (!bVar3) goto LAB_001836bf;
LAB_0018366a:
    uVar8 = ValidationState_t::GetOperandTypeId(_,inst,3);
    bVar3 = ValidationState_t::IsUnsignedIntVectorType(_,uVar8);
    if ((bVar3) && (uVar8 = ValidationState_t::GetDimension(_,uVar8), uVar8 == 4)) {
      return SPV_SUCCESS;
    }
LAB_0018369d:
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar12 = "Value must be a 4-component unsigned integer vector";
    break;
  case OpGroupNonUniformBallotBitExtract:
    bVar3 = ValidationState_t::IsBoolScalarType(_,(inst->inst_).type_id);
    if (bVar3) {
      uVar8 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar3 = ValidationState_t::IsUnsignedIntVectorType(_,uVar8);
      if ((bVar3) && (uVar8 = ValidationState_t::GetDimension(_,uVar8), uVar8 == 4)) {
        uVar8 = ValidationState_t::GetOperandTypeId(_,inst,4);
        bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar8);
        if (bVar3) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar12 = "Id must be an unsigned integer scalar";
        break;
      }
      goto LAB_0018369d;
    }
LAB_001836bf:
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar12 = "Result must be a boolean scalar";
    break;
  case OpGroupNonUniformBallotBitCount:
    bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,(inst->inst_).type_id);
    if (bVar3) {
      uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,4);
      pIVar11 = ValidationState_t::FindDef(_,uVar4);
      uVar8 = (pIVar11->inst_).type_id;
      bVar3 = ValidationState_t::IsUnsignedIntVectorType(_,uVar8);
      if ((bVar3) && (uVar8 = ValidationState_t::GetDimension(_,uVar8), uVar8 == 4)) {
        GVar10 = Instruction::GetOperandAs<spv::GroupOperation>(inst,3);
        bVar3 = spvIsVulkanEnv(_->context_->target_env);
        if (GVar10 < ClusteredReduce) {
          return SPV_SUCCESS;
        }
        if (!bVar3) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&operand,_,0x124d,(char *)0x0);
        std::operator<<((ostream *)&local_200,(string *)&operand);
        std::operator<<((ostream *)&local_200,
                        "In Vulkan: The OpGroupNonUniformBallotBitCount group operation must be only: Reduce, InclusiveScan, or ExclusiveScan."
                       );
        std::__cxx11::string::_M_dispose();
        goto LAB_00183504;
      }
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Expected Value to be a vector of four components of integer type scalar";
    }
    else {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Expected Result Type to be an unsigned integer type scalar.";
    }
    break;
  case OpGroupNonUniformBallotFindLSB:
  case OpGroupNonUniformBallotFindMSB:
    bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,(inst->inst_).type_id);
    if (bVar3) goto LAB_0018366a;
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar12 = "Result must be an unsigned integer scalar";
    break;
  case OpGroupNonUniformIAdd:
  case OpGroupNonUniformFAdd:
  case OpGroupNonUniformIMul:
  case OpGroupNonUniformFMul:
  case OpGroupNonUniformSMin:
  case OpGroupNonUniformUMin:
  case OpGroupNonUniformFMin:
  case OpGroupNonUniformSMax:
  case OpGroupNonUniformUMax:
  case OpGroupNonUniformFMax:
  case OpGroupNonUniformBitwiseAnd:
  case OpGroupNonUniformBitwiseOr:
  case OpGroupNonUniformBitwiseXor:
  case OpGroupNonUniformLogicalAnd:
  case OpGroupNonUniformLogicalOr:
  case OpGroupNonUniformLogicalXor:
    uVar1 = (inst->inst_).opcode;
    switch(uVar1) {
    case 0x15e:
    case 0x160:
    case 0x163:
switchD_00182e62_caseD_15e:
      bVar3 = ValidationState_t::IsFloatScalarOrVectorType(_,(inst->inst_).type_id);
      if (bVar3) {
LAB_00183202:
        uVar8 = ValidationState_t::GetOperandTypeId(_,inst,4);
        if (uVar8 != (inst->inst_).type_id) goto LAB_001834d8;
        GVar10 = Instruction::GetOperandAs<spv::GroupOperation>(inst,3);
        if ((ulong)((long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x60) {
          if (GVar10 - GroupOperationPartitionedReduceNV < 3) {
            ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar12 = 
            "Ballot must be present when Operation is PartitionedReduceNV, PartitionedInclusiveScanNV, or PartitionedExclusiveScanNV"
            ;
          }
          else {
            if (GVar10 != ClusteredReduce) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar12 = "ClusterSize must be present when Operation is ClusteredReduce";
          }
        }
        else {
          uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,5);
          pIVar11 = ValidationState_t::FindDef(_,uVar4);
          if (GVar10 - GroupOperationPartitionedReduceNV < 3) {
            if (((pIVar11 != (Instruction *)0x0) &&
                (bVar3 = ValidationState_t::IsIntScalarOrVectorType(_,(pIVar11->inst_).type_id),
                bVar3)) &&
               (uVar8 = ValidationState_t::GetDimension(_,(pIVar11->inst_).type_id), uVar8 == 4)) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar12 = "Ballot must be a 4-component integer vector";
          }
          else if ((pIVar11 == (Instruction *)0x0) ||
                  (bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,(pIVar11->inst_).type_id),
                  !bVar3)) {
            ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar12 = "ClusterSize must be an unsigned integer scalar";
          }
          else {
            iVar9 = spvOpcodeIsConstant((uint)(pIVar11->inst_).opcode);
            if (iVar9 != 0) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar12 = "ClusterSize must be a constant instruction";
          }
        }
      }
      else {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar12 = "Result must be a floating-point scalar or vector";
      }
      break;
    default:
      if ((uVar1 & 0xfffe) != 0x16a) {
        if (uVar1 == 0x165) goto switchD_00182e62_caseD_162;
        if (uVar1 != 0x16c) {
          if (uVar1 == 0x166) goto switchD_00182e62_caseD_15e;
          bVar3 = ValidationState_t::IsIntScalarOrVectorType(_,(inst->inst_).type_id);
          if (!bVar3) {
            ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar12 = "Result must be an integer scalar or vector";
            break;
          }
          goto LAB_00183202;
        }
      }
      bVar3 = ValidationState_t::IsBoolScalarOrVectorType(_,(inst->inst_).type_id);
      if (bVar3) goto LAB_00183202;
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Result must be a boolean scalar or vector";
      break;
    case 0x162:
switchD_00182e62_caseD_162:
      bVar3 = ValidationState_t::IsUnsignedIntScalarOrVectorType(_,(inst->inst_).type_id);
      if (bVar3) goto LAB_00183202;
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Result must be an unsigned integer scalar or vector";
    }
    break;
  default:
    if (uVar1 != 0x114f) {
      return SPV_SUCCESS;
    }
    uVar8 = (inst->inst_).type_id;
    bVar3 = ValidationState_t::IsIntScalarOrVectorType(_,uVar8);
    if (((bVar3) || (bVar3 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar8), bVar3)) ||
       (bVar3 = ValidationState_t::IsBoolScalarOrVectorType(_,uVar8), bVar3)) {
      uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,3);
      uVar7 = ValidationState_t::GetTypeId(_,uVar4);
      if (uVar7 == uVar8) {
        uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,4);
        uVar8 = ValidationState_t::GetTypeId(_,uVar4);
        bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar8);
        if (bVar3) {
          if ((ulong)((long)(inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(inst->words_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) < 0x19) {
            return SPV_SUCCESS;
          }
          uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,5);
          pIVar11 = ValidationState_t::FindDef(_,uVar4);
          if ((pIVar11 == (Instruction *)0x0) ||
             (bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,(pIVar11->inst_).type_id), !bVar3
             )) {
            ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar12 = "ClusterSize must be a scalar of integer type, whose Signedness operand is 0."
            ;
          }
          else {
            iVar9 = spvOpcodeIsConstant((uint)(pIVar11->inst_).opcode);
            if (iVar9 == 0) {
              ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar12 = "ClusterSize must come from a constant instruction.";
            }
            else {
              bVar3 = ValidationState_t::EvalConstantValUint64(_,uVar4,(uint64_t *)&operand);
              if (!bVar3) {
                return SPV_SUCCESS;
              }
              if (operand._M_dataplus._M_p + -1 <
                  (operand._M_dataplus._M_p ^ (ulong)(operand._M_dataplus._M_p + -1))) {
                return SPV_SUCCESS;
              }
              ValidationState_t::diag(&local_200,_,SPV_WARNING,inst);
              pcVar12 = "Behavior is undefined unless ClusterSize is at least 1 and a power of 2.";
            }
          }
        }
        else {
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar12 = "Delta must be a scalar of integer type, whose Signedness operand is 0.";
        }
      }
      else {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar12 = "Result Type must be the same as the type of Value.";
      }
    }
    else {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = 
      "Expected Result Type to be a scalar or vector of floating-point, integer or boolean type.";
    }
  }
  std::operator<<((ostream *)&local_200,pcVar12);
LAB_00183504:
  DiagnosticStream::~DiagnosticStream(&local_200);
  return local_200.error_;
}

Assistant:

spv_result_t NonUniformPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();

  if (spvOpcodeIsNonUniformGroupOperation(opcode)) {
    // OpGroupNonUniformQuadAllKHR and OpGroupNonUniformQuadAnyKHR don't have
    // scope paramter
    if ((opcode != spv::Op::OpGroupNonUniformQuadAllKHR) &&
        (opcode != spv::Op::OpGroupNonUniformQuadAnyKHR)) {
      const uint32_t execution_scope = inst->GetOperandAs<uint32_t>(2);
      if (auto error = ValidateExecutionScope(_, inst, execution_scope)) {
        return error;
      }
    }
  }

  switch (opcode) {
    case spv::Op::OpGroupNonUniformElect:
      return ValidateGroupNonUniformElect(_, inst);
    case spv::Op::OpGroupNonUniformAny:
    case spv::Op::OpGroupNonUniformAll:
      return ValidateGroupNonUniformAnyAll(_, inst);
    case spv::Op::OpGroupNonUniformAllEqual:
      return ValidateGroupNonUniformAllEqual(_, inst);
    case spv::Op::OpGroupNonUniformBroadcast:
    case spv::Op::OpGroupNonUniformShuffle:
    case spv::Op::OpGroupNonUniformShuffleXor:
    case spv::Op::OpGroupNonUniformShuffleUp:
    case spv::Op::OpGroupNonUniformShuffleDown:
    case spv::Op::OpGroupNonUniformQuadBroadcast:
    case spv::Op::OpGroupNonUniformQuadSwap:
      return ValidateGroupNonUniformBroadcastShuffle(_, inst);
    case spv::Op::OpGroupNonUniformBroadcastFirst:
      return ValidateGroupNonUniformBroadcastFirst(_, inst);
    case spv::Op::OpGroupNonUniformBallot:
      return ValidateGroupNonUniformBallot(_, inst);
    case spv::Op::OpGroupNonUniformInverseBallot:
      return ValidateGroupNonUniformInverseBallot(_, inst);
    case spv::Op::OpGroupNonUniformBallotBitExtract:
      return ValidateGroupNonUniformBallotBitExtract(_, inst);
    case spv::Op::OpGroupNonUniformBallotBitCount:
      return ValidateGroupNonUniformBallotBitCount(_, inst);
    case spv::Op::OpGroupNonUniformBallotFindLSB:
    case spv::Op::OpGroupNonUniformBallotFindMSB:
      return ValidateGroupNonUniformBallotFind(_, inst);
    case spv::Op::OpGroupNonUniformIAdd:
    case spv::Op::OpGroupNonUniformFAdd:
    case spv::Op::OpGroupNonUniformIMul:
    case spv::Op::OpGroupNonUniformFMul:
    case spv::Op::OpGroupNonUniformSMin:
    case spv::Op::OpGroupNonUniformUMin:
    case spv::Op::OpGroupNonUniformFMin:
    case spv::Op::OpGroupNonUniformSMax:
    case spv::Op::OpGroupNonUniformUMax:
    case spv::Op::OpGroupNonUniformFMax:
    case spv::Op::OpGroupNonUniformBitwiseAnd:
    case spv::Op::OpGroupNonUniformBitwiseOr:
    case spv::Op::OpGroupNonUniformBitwiseXor:
    case spv::Op::OpGroupNonUniformLogicalAnd:
    case spv::Op::OpGroupNonUniformLogicalOr:
    case spv::Op::OpGroupNonUniformLogicalXor:
      return ValidateGroupNonUniformArithmetic(_, inst);
    case spv::Op::OpGroupNonUniformRotateKHR:
      return ValidateGroupNonUniformRotateKHR(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}